

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O2

char * zlib_wrapper_name(zlib_wrapper type)

{
  if (type - kWrapperZLIB < 3) {
    return &DAT_00104388 + *(int *)(&DAT_00104388 + (ulong)(type - kWrapperZLIB) * 4);
  }
  error_exit("bad wrapper type",type);
}

Assistant:

const char* zlib_wrapper_name(zlib_wrapper type) {
  if (type == kWrapperZLIB)
    return "ZLIB";
  if (type == kWrapperGZIP)
    return "GZIP";
  if (type == kWrapperZRAW)
    return "RAW";
  error_exit("bad wrapper type", int(type));
  return nullptr;
}